

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  DataType DVar1;
  ostream *poVar2;
  char *pcVar3;
  uint uVar4;
  VarValue *value;
  int iVar5;
  string local_40;
  
  DVar1 = uniform->type;
  poVar2 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"compare_");
  if (DVar1 - TYPE_SAMPLER_1D < 0x1e) {
    DVar1 = getSamplerLookupReturnType(uniform->type);
    pcVar3 = glu::getDataTypeName(DVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"(texture(");
    poVar2 = std::operator<<(poVar2,(string *)uniform);
    poVar2 = std::operator<<(poVar2,", vec");
    uVar4 = uniform->type - TYPE_SAMPLER_2D;
    iVar5 = 0;
    if (uVar4 < 0x19) {
      iVar5 = *(int *)(&DAT_0185f7d8 + (ulong)uVar4 * 4);
    }
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
    std::operator<<(poVar2,"(0.0))");
  }
  else {
    pcVar3 = glu::getDataTypeName(uniform->type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"(");
    std::operator<<(poVar2,(string *)uniform);
  }
  poVar2 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  shaderVarValueStr_abi_cxx11_(&local_40,(Functional *)&uniform->finalValue,value);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
		dst << "compare_" << glu::getDataTypeName(getSamplerLookupReturnType(uniform.type)) << "(texture(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}